

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetScrollHereX(float center_x_ratio)

{
  ImGuiWindow *pIVar1;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float target_pos_x;
  float spacing_x;
  ImGuiWindow *window;
  ImGuiContext *g;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  
  pIVar1 = GImGui->CurrentWindow;
  fVar3 = (GImGui->Style).ItemSpacing.x;
  fVar2 = ImLerp<float>((pIVar1->DC).LastItemRect.Min.x - fVar3,
                        (pIVar1->DC).LastItemRect.Max.x + fVar3,in_XMM0_Da);
  SetScrollFromPosX((ImGuiWindow *)CONCAT44(fVar3,fVar2),in_stack_ffffffffffffffdc,
                    in_stack_ffffffffffffffd8);
  fVar3 = ImMax<float>(0.0,(pIVar1->WindowPadding).x - fVar3);
  (pIVar1->ScrollTargetEdgeSnapDist).x = fVar3;
  return;
}

Assistant:

void ImGui::SetScrollHereX(float center_x_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_x = g.Style.ItemSpacing.x;
    float target_pos_x = ImLerp(window->DC.LastItemRect.Min.x - spacing_x, window->DC.LastItemRect.Max.x + spacing_x, center_x_ratio);
    SetScrollFromPosX(window, target_pos_x - window->Pos.x, center_x_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.x = ImMax(0.0f, window->WindowPadding.x - spacing_x);
}